

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerReflection::compile_abi_cxx11_
          (string *__return_storage_ptr__,CompilerReflection *this)

{
  Stream *this_00;
  __shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  ::std::make_shared<simple_json::Stream>();
  ::std::__shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->json_stream).
              super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>,&_Stack_28);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  this_00 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  this_00->current_locale_radix_character =
       (this->super_CompilerGLSL).current_locale_radix_character;
  simple_json::Stream::begin_json_object(this_00);
  CompilerGLSL::reorder_type_alias(&this->super_CompilerGLSL);
  emit_entry_points(this);
  emit_types(this);
  emit_resources(this);
  emit_specialization_constants(this);
  simple_json::Stream::end_json_object
            ((this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  StringStream<4096ul,4096ul>::str_abi_cxx11_
            (__return_storage_ptr__,
             (StringStream<4096ul,4096ul> *)
             &((this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->buffer);
  return __return_storage_ptr__;
}

Assistant:

string CompilerReflection::compile()
{
	json_stream = std::make_shared<simple_json::Stream>();
	json_stream->set_current_locale_radix_character(current_locale_radix_character);
	json_stream->begin_json_object();
	reorder_type_alias();
	emit_entry_points();
	emit_types();
	emit_resources();
	emit_specialization_constants();
	json_stream->end_json_object();
	return json_stream->str();
}